

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

void pageant_passphrase_request_refused(PageantClientDialogId *dlgid)

{
  PageantKeyRequestNode **ppPVar1;
  PageantKeyRequestNode *pPVar2;
  
  if (gui_request_in_progress == '\0') {
    __assert_fail("gui_request_in_progress",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",
                  0x251,"void pageant_passphrase_request_refused(PageantClientDialogId *)");
  }
  gui_request_in_progress = 0;
  *(undefined1 *)&dlgid[-6].dummy = 0;
  fail_requests_for_key((PageantKey *)(dlgid + -0x14),"user refused to supply passphrase");
  pPVar2 = requests_blocked_on_gui.next;
  if (requests_blocked_on_gui.next != &requests_blocked_on_gui) {
    do {
      queue_toplevel_callback(pageant_async_op_callback,pPVar2 + 1);
      ppPVar1 = &pPVar2->next;
      pPVar2 = *ppPVar1;
    } while (*ppPVar1 != &requests_blocked_on_gui);
  }
  return;
}

Assistant:

void pageant_passphrase_request_refused(PageantClientDialogId *dlgid)
{
    PageantKey *pk = container_of(dlgid, PageantKey, dlgid);

    assert(gui_request_in_progress);
    gui_request_in_progress = false;
    pk->decryption_prompt_active = false;

    fail_requests_for_key(pk, "user refused to supply passphrase");

    unblock_pending_gui_requests();
}